

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.h
# Opt level: O2

void __thiscall
slang::syntax::ImplementsClauseSyntax::ImplementsClauseSyntax
          (ImplementsClauseSyntax *this,Token keyword,
          SeparatedSyntaxList<slang::syntax::NameSyntax> *interfaces)

{
  size_t sVar1;
  SyntaxNode *pSVar2;
  undefined4 uVar3;
  NameSyntax *pNVar4;
  undefined8 uVar5;
  SeparatedSyntaxList<slang::syntax::NameSyntax> *__range2;
  iterator __begin2;
  iterator_base<slang::syntax::NameSyntax_*> local_30;
  
  uVar5 = keyword._0_8_;
  (this->super_SyntaxNode).kind = ImplementsClause;
  (this->super_SyntaxNode).parent = (SyntaxNode *)0x0;
  (this->super_SyntaxNode).previewNode = (SyntaxNode *)0x0;
  (this->keyword).kind = (short)uVar5;
  (this->keyword).field_0x2 = (char)((ulong)uVar5 >> 0x10);
  (this->keyword).numFlags = (NumericTokenFlags)(char)((ulong)uVar5 >> 0x18);
  (this->keyword).rawLen = (int)((ulong)uVar5 >> 0x20);
  (this->keyword).info = keyword.info;
  uVar3 = *(undefined4 *)&(interfaces->super_SyntaxListBase).super_SyntaxNode.field_0x4;
  pSVar2 = (interfaces->super_SyntaxListBase).super_SyntaxNode.parent;
  (this->interfaces).super_SyntaxListBase.super_SyntaxNode.kind =
       (interfaces->super_SyntaxListBase).super_SyntaxNode.kind;
  *(undefined4 *)&(this->interfaces).super_SyntaxListBase.super_SyntaxNode.field_0x4 = uVar3;
  (this->interfaces).super_SyntaxListBase.super_SyntaxNode.parent = pSVar2;
  (this->interfaces).super_SyntaxListBase.super_SyntaxNode.previewNode =
       (interfaces->super_SyntaxListBase).super_SyntaxNode.previewNode;
  (this->interfaces).super_SyntaxListBase.childCount = (interfaces->super_SyntaxListBase).childCount
  ;
  (this->interfaces).super_SyntaxListBase._vptr_SyntaxListBase =
       (_func_int **)&PTR_getChild_005964b8;
  sVar1 = (interfaces->elements)._M_extent._M_extent_value;
  (this->interfaces).elements._M_ptr = (interfaces->elements)._M_ptr;
  (this->interfaces).elements._M_extent._M_extent_value = sVar1;
  (this->interfaces).super_SyntaxListBase.super_SyntaxNode.parent = &this->super_SyntaxNode;
  local_30.index = 0;
  sVar1 = (this->interfaces).elements._M_extent._M_extent_value;
  local_30.list = &this->interfaces;
  for (; (local_30.list != &this->interfaces || (local_30.index != sVar1 + 1 >> 1));
      local_30.index = local_30.index + 1) {
    pNVar4 = SeparatedSyntaxList<slang::syntax::NameSyntax>::
             iterator_base<slang::syntax::NameSyntax_*>::dereference(&local_30);
    (pNVar4->super_ExpressionSyntax).super_SyntaxNode.parent = &this->super_SyntaxNode;
  }
  return;
}

Assistant:

ImplementsClauseSyntax(Token keyword, const SeparatedSyntaxList<NameSyntax>& interfaces) :
        SyntaxNode(SyntaxKind::ImplementsClause), keyword(keyword), interfaces(interfaces) {
        this->interfaces.parent = this;
        for (auto child : this->interfaces)
            child->parent = this;
    }